

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O2

bool llvm::function_ref<bool(llvm::DWARFDebugLoclists::Entry_const&)>::
     callback_fn<llvm::DWARFDebugLoclists::dumpLocationList(llvm::DWARFDataExtractor_const&,unsigned_long*,unsigned_short,llvm::raw_ostream&,unsigned_long,llvm::MCRegisterInfo_const*,llvm::DWARFUnit*,llvm::DIDumpOptions,unsigned_int)::__0>
               (intptr_t callable,Entry *params)

{
  DWARFDebugLoclists::Entry::dump
            (params,*(raw_ostream **)callable,*(uint64_t **)(callable + 8),
             *(char *)(*(long *)(callable + 0x10) + 0x10) != '\0',
             (uint)*(byte *)(*(long *)(callable + 0x10) + 0x11),
             (MCRegisterInfo *)**(undefined8 **)(callable + 0x18),
             (DWARFUnit *)**(undefined8 **)(callable + 0x20),**(DIDumpOptions **)(callable + 0x28),
             **(uint **)(callable + 0x30),**(size_t **)(callable + 0x38));
  return true;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params ...params) {
    return (*reinterpret_cast<Callable*>(callable))(
        std::forward<Params>(params)...);
  }